

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_lu.cc
# Opt level: O0

int X509_LOOKUP_by_subject(X509_LOOKUP *ctx,int type,X509_NAME *name,X509_OBJECT *ret)

{
  long lVar1;
  int iVar2;
  X509_OBJECT *ret_local;
  X509_NAME *name_local;
  int type_local;
  X509_LOOKUP *ctx_local;
  
  lVar1._0_4_ = ctx->init;
  lVar1._4_4_ = ctx->skip;
  if ((lVar1 == 0) || (*(long *)(*(long *)ctx + 0x18) == 0)) {
    ctx_local._4_4_ = 0;
  }
  else {
    iVar2 = (**(code **)(*(long *)ctx + 0x18))(ctx,type,name,ret);
    ctx_local._4_4_ = (uint)(0 < iVar2);
  }
  return ctx_local._4_4_;
}

Assistant:

static int X509_LOOKUP_by_subject(X509_LOOKUP *ctx, int type, X509_NAME *name,
                                  X509_OBJECT *ret) {
  if (ctx->method == NULL || ctx->method->get_by_subject == NULL) {
    return 0;
  }
  // Note |get_by_subject| leaves |ret| in an inconsistent state. It has
  // pointers to an |X509| or |X509_CRL|, but has not bumped the refcount yet.
  // For now, the caller is expected to fix this, but ideally we'd fix the
  // |X509_LOOKUP| convention itself.
  return ctx->method->get_by_subject(ctx, type, name, ret) > 0;
}